

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kevent.c
# Opt level: O1

char * kevent_dump(kevent *kev)

{
  char *__s;
  short filt;
  ulong uVar1;
  char *__s_00;
  char *pcVar2;
  size_t sVar3;
  
  uVar1 = kev->ident;
  __s_00 = (char *)__tls_get_addr(&PTR_0010bfd0);
  filt = kev->filter;
  pcVar2 = filter_name(filt);
  snprintf(__s_00 + 0x870,0x40,"%d (%s)",(ulong)(uint)(int)filt,pcVar2);
  pcVar2 = __s_00 + 0x8b0;
  snprintf(pcVar2,0x400,"flags=0x%04x (",(ulong)kev->flags);
  if ((kev->flags & 1) != 0) {
    sVar3 = strlen(pcVar2);
    builtin_strncpy(__s_00 + sVar3 + 0x8b0,"EV_ADD ",8);
  }
  if ((kev->flags & 4) != 0) {
    sVar3 = strlen(pcVar2);
    builtin_strncpy(__s_00 + sVar3 + 0x8b0,"EV_ENABLE ",0xb);
  }
  if ((kev->flags & 8) != 0) {
    sVar3 = strlen(pcVar2);
    builtin_strncpy(__s_00 + sVar3 + 0x8b0,"EV_DISABLE ",0xc);
  }
  if ((kev->flags & 2) != 0) {
    sVar3 = strlen(pcVar2);
    builtin_strncpy(__s_00 + sVar3 + 0x8b0,"EV_DELETE ",0xb);
  }
  if ((kev->flags & 0x10) != 0) {
    sVar3 = strlen(pcVar2);
    builtin_strncpy(__s_00 + sVar3 + 0x8b0,"EV_ONESHOT ",0xc);
  }
  if ((kev->flags & 0x20) != 0) {
    sVar3 = strlen(pcVar2);
    builtin_strncpy(__s_00 + sVar3 + 0x8b0,"EV_CLEAR ",10);
  }
  if ((short)kev->flags < 0) {
    sVar3 = strlen(pcVar2);
    builtin_strncpy(__s_00 + sVar3 + 0x8b0,"EV_EOF ",8);
  }
  if ((kev->flags & 0x4000) != 0) {
    sVar3 = strlen(pcVar2);
    builtin_strncpy(__s_00 + sVar3 + 0x8b0,"EV_ERROR ",10);
  }
  if ((kev->flags & 0x80) != 0) {
    sVar3 = strlen(pcVar2);
    builtin_strncpy(__s_00 + sVar3 + 0x8b0,"EV_DISPATCH ",0xd);
  }
  if ((kev->flags & 0x40) != 0) {
    sVar3 = strlen(pcVar2);
    builtin_strncpy(__s_00 + sVar3 + 0x8b0,"EV_RECEIPT ",0xc);
  }
  sVar3 = strlen(pcVar2);
  if (pcVar2[sVar3 - 1] == ' ') {
    __s_00[sVar3 + 0x8af] = '\0';
  }
  sVar3 = strlen(pcVar2);
  (pcVar2 + sVar3)[0] = ')';
  (pcVar2 + sVar3)[1] = '\0';
  __s = __s_00 + 0xcb0;
  snprintf(__s,0x400,"fflags=0x%04x (",(ulong)kev->fflags);
  switch(kev->filter) {
  case -0xc:
    if ((kev->fflags & 1) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_VERSION ",0xe);
    }
    if ((kev->fflags & 2) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_VERSION_STR ",0x12);
    }
    if ((kev->fflags & 3) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_THREAD_SAFE ",0x12);
    }
    if ((kev->fflags & 4) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_FORK_CLEANUP ",0x13);
    }
    break;
  case -0xb:
    if ((kev->fflags & 0x40000000) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_FFAND ",0xc);
    }
    if ((int)kev->fflags < 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_FFOR ",0xb);
    }
    if (0x3fffffff < kev->fflags) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_FFCOPY ",0xd);
    }
    if ((kev->fflags & 0x1000000) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_TRIGGER ",0xe);
    }
    break;
  case -7:
    if ((kev->fflags & 1) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_SECONDS ",0xe);
    }
    if ((kev->fflags & 2) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_USECONDS ",0xf);
    }
    if ((kev->fflags & 4) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_NSECONDS ",0xf);
    }
    if ((kev->fflags & 8) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_ABSOLUTE ",0xf);
    }
    break;
  case -5:
    if ((int)kev->fflags < 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_EXIT ",0xb);
    }
    if ((kev->fflags & 0x40000000) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_FORK ",0xb);
    }
    if ((kev->fflags & 0x20000000) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_EXEC ",0xb);
    }
    break;
  case -4:
    if ((kev->fflags & 1) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_DELETE ",0xd);
    }
    if ((kev->fflags & 2) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_WRITE ",0xc);
    }
    if ((kev->fflags & 4) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_EXTEND ",0xd);
    }
    if ((kev->fflags & 8) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_ATTRIB ",0xd);
    }
    if ((kev->fflags & 0x10) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_LINK ",0xb);
    }
    if ((kev->fflags & 0x20) != 0) {
      sVar3 = strlen(__s);
      builtin_strncpy(__s_00 + sVar3 + 0xcb0,"NOTE_RENAME ",0xd);
    }
  }
  sVar3 = strlen(__s);
  if (__s[sVar3 - 1] == ' ') {
    __s_00[sVar3 + 0xcaf] = '\0';
  }
  sVar3 = strlen(__s);
  (__s + sVar3)[0] = ')';
  (__s + sVar3)[1] = '\0';
  snprintf(__s_00,0x863,"{ ident=%i, filter=%s, %s, %s, data=%d, udata=%p }",uVar1 & 0xffffffff,
           __s_00 + 0x870,pcVar2,__s,(ulong)(uint)kev->data,kev->udata);
  return __s_00;
}

Assistant:

const char *
kevent_dump(const struct kevent *kev)
{
    static __thread char buf[2147];

    snprintf((char *) buf, sizeof(buf),
            "{ ident=%i, filter=%s, %s, %s, data=%d, udata=%p }",
            (u_int) kev->ident,
            kevent_filter_dump(kev),
            kevent_flags_dump(kev),
            kevent_fflags_dump(kev),
            (int) kev->data,
            kev->udata);

    return ((const char *) buf);
}